

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

OperatorResultType
duckdb::RangeDateTimeFunction<true>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  interval_t *piVar1;
  bool bVar2;
  RangeDateTimeLocalState *pRVar3;
  RangeDateTimeLocalState *pRVar4;
  timestamp_t *ptVar5;
  timestamp_t tVar6;
  DataChunk *in_RCX;
  DataChunk *in_RDX;
  timestamp_t *data;
  idx_t size;
  RangeDateTimeLocalState *state;
  RangeDateTimeLocalState *in_stack_000000a0;
  idx_t in_stack_000000a8;
  DataChunk *in_stack_000000b0;
  size_type in_stack_ffffffffffffff88;
  RangeDateTimeLocalState *in_stack_ffffffffffffff90;
  timestamp_t in_stack_ffffffffffffff98;
  ulong local_38;
  
  optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)in_stack_ffffffffffffff90);
  pRVar3 = LocalTableFunctionState::Cast<duckdb::RangeDateTimeLocalState>
                     (&in_stack_ffffffffffffff90->super_LocalTableFunctionState);
  while( true ) {
    if ((pRVar3->initialized_row & 1U) == 0) {
      in_stack_ffffffffffffff90 = (RangeDateTimeLocalState *)pRVar3->current_input_row;
      pRVar4 = (RangeDateTimeLocalState *)DataChunk::size(in_RDX);
      if (pRVar4 <= in_stack_ffffffffffffff90) {
        pRVar3->current_input_row = 0;
        pRVar3->initialized_row = false;
        return NEED_MORE_INPUT;
      }
      GenerateRangeDateTimeParameters<true>(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      pRVar3->initialized_row = true;
      (pRVar3->current_state).value = (pRVar3->start).value;
    }
    if ((pRVar3->empty_range & 1U) != 0) break;
    local_38 = 0;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    ptVar5 = FlatVector::GetData<duckdb::timestamp_t>((Vector *)0x1480d72);
    while ((bVar2 = RangeDateTimeLocalState::Finished
                              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98), !bVar2 &&
           (local_38 < 0x800))) {
      ptVar5[local_38].value = (pRVar3->current_state).value;
      piVar1 = &pRVar3->increment;
      in_stack_ffffffffffffff98.value._0_4_ = piVar1->months;
      in_stack_ffffffffffffff98.value._4_4_ = piVar1->days;
      tVar6 = AddOperator::Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                        ((pRVar3->current_state).value,*piVar1);
      (pRVar3->current_state).value = tVar6.value;
      local_38 = local_38 + 1;
    }
    if (local_38 != 0) {
      DataChunk::SetCardinality(in_RCX,local_38);
      return HAVE_MORE_OUTPUT;
    }
    pRVar3->current_input_row = pRVar3->current_input_row + 1;
    pRVar3->initialized_row = false;
  }
  DataChunk::SetCardinality(in_RCX,0);
  pRVar3->current_input_row = pRVar3->current_input_row + 1;
  pRVar3->initialized_row = false;
  return HAVE_MORE_OUTPUT;
}

Assistant:

static OperatorResultType RangeDateTimeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                                DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeDateTimeLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeDateTimeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_state = state.start;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		idx_t size = 0;
		auto data = FlatVector::GetData<timestamp_t>(output.data[0]);
		while (true) {
			if (state.Finished(state.current_state)) {
				break;
			}
			if (size >= STANDARD_VECTOR_SIZE) {
				break;
			}
			data[size++] = state.current_state;
			state.current_state =
			    AddOperator::Operation<timestamp_t, interval_t, timestamp_t>(state.current_state, state.increment);
		}
		if (size == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		output.SetCardinality(size);
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}